

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::emit_wave_multi_prefix_op_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Builder *pBVar5;
  Value *pVVar6;
  Type *pTVar7;
  Operation *this;
  Operation *pOVar8;
  Operation *pOVar9;
  HelperCall call;
  uint i;
  long lVar10;
  Op op;
  Id local_68;
  Id local_64;
  uint32_t op_kind;
  Id ballot [4];
  Id local_48;
  Id IStack_44;
  Id IStack_40;
  Id IStack_3c;
  
  pBVar5 = Converter::Impl::builder(impl);
  call = WaveMultiPrefixBitAnd;
  bVar1 = get_constant_operand(&instruction->super_Instruction,6,&op_kind);
  if (bVar1) {
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    pTVar7 = LLVMBC::Value::getType(pVVar6);
    bVar1 = LLVMBC::Type::isIntegerTy(pTVar7);
    switch((undefined1)op_kind) {
    case 0:
      op = OpGroupNonUniformFAdd - bVar1;
      call = bVar1 | WaveMultiPrefixFAdd;
      break;
    case 1:
      op = OpGroupNonUniformBitwiseAnd;
      break;
    case 2:
      call = WaveMultiPrefixBitOr;
      op = OpGroupNonUniformBitwiseOr;
      break;
    case 3:
      call = WaveMultiPrefixBitXor;
      op = OpGroupNonUniformBitwiseXor;
      break;
    case 4:
      op = OpGroupNonUniformFMul - bVar1;
      call = bVar1 | WaveMultiPrefixFMul;
      break;
    default:
      goto switchD_0015d87e_default;
    }
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    pTVar7 = LLVMBC::Value::getType(pVVar6);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar7,0);
    if ((impl->options).nv_subgroup_partition_enabled == true) {
      spv::Builder::addExtension(pBVar5,"SPV_NV_shader_subgroup_partitioned");
      spv::Builder::addCapability(pBVar5,CapabilityGroupNonUniformPartitionedNV);
      this = Converter::Impl::allocate(impl,op,(Value *)instruction);
      IVar2 = spv::Builder::makeUintConstant(pBVar5,3,false);
      Operation::add_id(this,IVar2);
      Operation::add_literal(this,8);
    }
    else {
      IVar2 = SPIRVModule::get_helper_call_id(impl->spirv_module,call,IVar2);
      this = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction);
      Operation::add_id(this,IVar2);
    }
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(this,IVar2);
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)lVar10 + 2);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
      ballot[lVar10] = IVar2;
    }
    IVar2 = spv::Builder::makeUintType(pBVar5,0x20);
    IVar2 = Converter::Impl::build_vector(impl,IVar2,ballot,4);
    if ((impl->options).nv_subgroup_partition_enabled != false) {
      pBVar5 = Converter::Impl::builder(impl);
      IVar3 = spv::Builder::makeUintType(pBVar5,0x20);
      IVar3 = spv::Builder::makeVectorType(pBVar5,IVar3,4);
      spv::Builder::addCapability(pBVar5,CapabilityGroupNonUniformBallot);
      pOVar8 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar3);
      local_68 = 0;
      IVar4 = spv::Builder::makeUintConstant(pBVar5,3,false);
      Operation::add_id(pOVar8,IVar4);
      if (((impl->execution_model == ExecutionModelFragment) &&
          ((impl->options).strict_helper_lane_waveops == true)) &&
         (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
        IVar4 = spv::Builder::makeBoolType(pBVar5);
        pOVar9 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar4);
        Converter::Impl::add(impl,pOVar9,false);
        local_68 = pOVar9->id;
        IVar4 = spv::Builder::makeUintType(pBVar5,0x20);
        IVar4 = spv::Builder::makeVectorType(pBVar5,IVar4,4);
        pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar4);
        IVar4 = spv::Builder::makeUintConstant(pBVar5,3,false);
        Operation::add_id(pOVar9,IVar4);
        Operation::add_id(pOVar9,local_68);
        Converter::Impl::add(impl,pOVar9,false);
        spv::Builder::addCapability(pBVar5,CapabilityGroupNonUniformBallot);
        local_64 = pOVar9->id;
        IVar4 = spv::Builder::makeBoolType(pBVar5);
        pOVar9 = Converter::Impl::allocate(impl,OpLogicalNot,IVar4);
        Operation::add_id(pOVar9,local_68);
        Converter::Impl::add(impl,pOVar9,false);
        IVar4 = pOVar9->id;
      }
      else {
        IVar4 = spv::Builder::makeBoolConstant(pBVar5,true,false);
        local_64 = 0;
      }
      Operation::add_id(pOVar8,IVar4);
      Converter::Impl::add(impl,pOVar8,false);
      pOVar9 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar3);
      Operation::add_id(pOVar9,IVar2);
      Operation::add_id(pOVar9,pOVar8->id);
      Converter::Impl::add(impl,pOVar9,false);
      if (((impl->execution_model == ExecutionModelFragment) &&
          ((impl->options).strict_helper_lane_waveops == true)) &&
         (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
        local_48 = local_68;
        IStack_44 = local_68;
        IStack_40 = local_68;
        IStack_3c = local_68;
        IVar2 = spv::Builder::makeBoolType(pBVar5);
        IVar2 = Converter::Impl::build_vector(impl,IVar2,&local_48,4);
        IVar3 = spv::Builder::makeUintType(pBVar5,0x20);
        IVar3 = spv::Builder::makeVectorType(pBVar5,IVar3,4);
        pOVar8 = Converter::Impl::allocate(impl,OpSelect,IVar3);
        Operation::add_id(pOVar8,IVar2);
        Operation::add_id(pOVar8,local_64);
        Operation::add_id(pOVar8,pOVar9->id);
        Converter::Impl::add(impl,pOVar8,false);
        IVar2 = pOVar8->id;
      }
      else {
        IVar2 = pOVar9->id;
      }
    }
    Operation::add_id(this,IVar2);
    if ((((impl->options).nv_subgroup_partition_enabled == false) &&
        (impl->execution_model == ExecutionModelFragment)) &&
       (((impl->options).strict_helper_lane_waveops == true &&
        (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)))) {
      pBVar5 = Converter::Impl::builder(impl);
      IVar2 = spv::Builder::makeBoolType(pBVar5);
      pOVar8 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar2);
      Converter::Impl::add(impl,pOVar8,false);
      Operation::add_id(this,pOVar8->id);
    }
    Converter::Impl::add(impl,this,false);
    bVar1 = true;
  }
  else {
switchD_0015d87e_default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool emit_wave_multi_prefix_op_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 6, &op_kind))
		return false;

	HelperCall helper_call;
	spv::Op partitioned_op;
	bool fp = !instruction->getOperand(1)->getType()->isIntegerTy();

	switch (static_cast<DXIL::WaveMultiPrefixOpKind>(op_kind))
	{
	case DXIL::WaveMultiPrefixOpKind::Sum:
		helper_call = fp ? HelperCall::WaveMultiPrefixFAdd : HelperCall::WaveMultiPrefixIAdd;
		partitioned_op = fp ? spv::OpGroupNonUniformFAdd : spv::OpGroupNonUniformIAdd;
		break;

	case DXIL::WaveMultiPrefixOpKind::Product:
		helper_call = fp ? HelperCall::WaveMultiPrefixFMul : HelperCall::WaveMultiPrefixIMul;
		partitioned_op = fp ? spv::OpGroupNonUniformFMul : spv::OpGroupNonUniformIMul;
		break;

	case DXIL::WaveMultiPrefixOpKind::And:
		helper_call = HelperCall::WaveMultiPrefixBitAnd;
		partitioned_op = spv::OpGroupNonUniformBitwiseAnd;
		break;

	case DXIL::WaveMultiPrefixOpKind::Or:
		helper_call = HelperCall::WaveMultiPrefixBitOr;
		partitioned_op = spv::OpGroupNonUniformBitwiseOr;
		break;

	case DXIL::WaveMultiPrefixOpKind::Xor:
		helper_call = HelperCall::WaveMultiPrefixBitXor;
		partitioned_op = spv::OpGroupNonUniformBitwiseXor;
		break;

	default:
		return false;
	}

	spv::Id type_id = impl.get_type_id(instruction->getOperand(1)->getType());

	Operation *op;

	if (impl.options.nv_subgroup_partition_enabled)
	{
		builder.addExtension("SPV_NV_shader_subgroup_partitioned");
		builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
		op = impl.allocate(partitioned_op, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_literal(spv::GroupOperationPartitionedExclusiveScanNV);
	}
	else
	{
		spv::Id call_id = impl.spirv_module.get_helper_call_id(helper_call, type_id);
		op = impl.allocate(spv::OpFunctionCall, instruction);
		op->add_id(call_id);
	}

	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	spv::Id ballot[4];
	for (unsigned i = 0; i < 4; i++)
		ballot[i] = impl.get_id_for_value(instruction->getOperand(2 + i));

	spv::Id ballot_value = impl.build_vector(builder.makeUintType(32), ballot, 4);

	// Have to explicitly ignore inactive lanes here to make sure that lanes in the same partition have equal
	// partition values.
	if (impl.options.nv_subgroup_partition_enabled)
		ballot_value = emit_masked_ballot(impl, ballot_value);

	op->add_id(ballot_value);

	if (!impl.options.nv_subgroup_partition_enabled &&
	    wave_op_needs_helper_lane_masking(impl))
	{
		auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
		impl.add(is_helper_lane);
		op->add_id(is_helper_lane->id);
	}

	impl.add(op);

	return true;
}